

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect_four.cpp
# Opt level: O0

void main_program(void)

{
  double dVar1;
  bool bVar2;
  ostream *poVar3;
  exception *anon_var_0;
  ConnectFourState *in_stack_00000108;
  Move move;
  undefined1 in_stack_00000120 [24];
  ConnectFourState state;
  ComputeOptions player2_options;
  ComputeOptions player1_options;
  bool human_player;
  ConnectFourState *in_stack_fffffffffffffe58;
  ConnectFourState *in_stack_fffffffffffffe60;
  int current_player_to_move;
  ConnectFourState *in_stack_fffffffffffffe68;
  ConnectFourState *in_stack_fffffffffffffe70;
  int in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffebc;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  int local_78 [4];
  int local_68;
  ComputeOptions local_38;
  ComputeOptions local_20;
  byte local_1;
  
  local_1 = 1;
  MCTS::ComputeOptions::ComputeOptions(&local_20);
  MCTS::ComputeOptions::ComputeOptions(&local_38);
  local_20.max_iterations = 100000;
  local_20.verbose = true;
  local_38.max_iterations = 10000;
  local_38.verbose = true;
  ConnectFourState::ConnectFourState
            ((ConnectFourState *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
             in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8);
  while (bVar2 = ConnectFourState::has_moves(in_stack_fffffffffffffe68), bVar2) {
    poVar3 = (ostream *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    std::operator<<(poVar3,"State: ");
    poVar3 = operator<<((ostream *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    local_78[0] = -1;
    if (local_68 == 1) {
      ConnectFourState::ConnectFourState(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
      in_stack_fffffffffffffe68 = (ConnectFourState *)CONCAT71(local_20._17_7_,local_20.verbose);
      in_stack_fffffffffffffe58 =
           (ConnectFourState *)CONCAT44(local_20.max_iterations,local_20.number_of_threads);
      in_stack_fffffffffffffe60 = (ConnectFourState *)local_20.max_time;
      local_78[0] = MCTS::compute_move<ConnectFourState>
                              (in_stack_00000108,(ComputeOptions)in_stack_00000120);
      ConnectFourState::~ConnectFourState((ConnectFourState *)0x12b795);
      ConnectFourState::do_move
                (in_stack_fffffffffffffe70,(Move)((ulong)in_stack_fffffffffffffe68 >> 0x20));
    }
    else if ((local_1 & 1) == 0) {
      ConnectFourState::ConnectFourState(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
      in_stack_fffffffffffffe68 = (ConnectFourState *)CONCAT71(local_38._17_7_,local_38.verbose);
      in_stack_fffffffffffffe58 =
           (ConnectFourState *)CONCAT44(local_38.max_iterations,local_38.number_of_threads);
      in_stack_fffffffffffffe60 = (ConnectFourState *)local_38.max_time;
      local_78[0] = MCTS::compute_move<ConnectFourState>
                              (in_stack_00000108,(ComputeOptions)in_stack_00000120);
      ConnectFourState::~ConnectFourState((ConnectFourState *)0x12b96b);
      ConnectFourState::do_move
                (in_stack_fffffffffffffe70,(Move)((ulong)in_stack_fffffffffffffe68 >> 0x20));
    }
    else {
      std::operator<<((ostream *)&std::cout,"Input your move: ");
      local_78[0] = -1;
      std::istream::operator>>((istream *)&std::cin,local_78);
      ConnectFourState::do_move
                (in_stack_fffffffffffffe70,(Move)((ulong)in_stack_fffffffffffffe68 >> 0x20));
    }
  }
  poVar3 = (ostream *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  std::operator<<(poVar3,"Final state: ");
  poVar3 = operator<<((ostream *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  current_player_to_move = (int)((ulong)in_stack_fffffffffffffe60 >> 0x20);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  dVar1 = ConnectFourState::get_result(in_stack_fffffffffffffe68,current_player_to_move);
  if ((dVar1 != 1.0) || (NAN(dVar1))) {
    dVar1 = ConnectFourState::get_result(in_stack_fffffffffffffe68,current_player_to_move);
    if ((dVar1 != 1.0) || (NAN(dVar1))) {
      poVar3 = std::operator<<((ostream *)&std::cout,"Nobody wins!");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cout,"Player 2 wins!");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,"Player 1 wins!");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  ConnectFourState::~ConnectFourState((ConnectFourState *)0x12bb0d);
  return;
}

Assistant:

void main_program()
{
	using namespace std;

	bool human_player = true;

	MCTS::ComputeOptions player1_options, player2_options;
	player1_options.max_iterations = 100000;
	player1_options.verbose = true;
	player2_options.max_iterations =  10000;
	player2_options.verbose = true;

	ConnectFourState state;
	while (state.has_moves()) {
		cout << endl << "State: " << state << endl;

		ConnectFourState::Move move = ConnectFourState::no_move;
		if (state.player_to_move == 1) {
			move = MCTS::compute_move(state, player1_options);
			state.do_move(move);
		}
		else {
			if (human_player) {
				while (true) {
					cout << "Input your move: ";
					move = ConnectFourState::no_move;
					cin >> move;
					try {
						state.do_move(move);
						break;
					}
					catch (std::exception& ) {
						cout << "Invalid move." << endl;
					}
				}
			}
			else {
				move = MCTS::compute_move(state, player2_options);
				state.do_move(move);
			}
		}
	}

	cout << endl << "Final state: " << state << endl;

	if (state.get_result(2) == 1.0) {
		cout << "Player 1 wins!" << endl;
	}
	else if (state.get_result(1) == 1.0) {
		cout << "Player 2 wins!" << endl;
	}
	else {
		cout << "Nobody wins!" << endl;
	}
}